

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O0

void Abc_FlowRetime_UpdateLags_back_rec(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  int local_1c;
  int i;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjIsPo(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsPo(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretMain.c"
                  ,0x4f1,"void Abc_FlowRetime_UpdateLags_back_rec(Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjIsLatch(pObj);
  if (iVar1 == 0) {
    iVar1 = Abc_ObjIsBo(pObj);
    if ((iVar1 == 0) && (iVar1 = Abc_NodeIsTravIdCurrent(pObj), iVar1 == 0)) {
      Abc_NodeSetTravIdCurrent(pObj);
      iVar1 = Abc_ObjIsNode(pObj);
      if (iVar1 != 0) {
        iVar1 = Abc_FlowRetime_GetLag(pObj);
        Abc_FlowRetime_SetLag(pObj,iVar1 + 1);
      }
      for (local_1c = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_1c < iVar1; local_1c = local_1c + 1)
      {
        pObj_00 = Abc_ObjFanout(pObj,local_1c);
        Abc_FlowRetime_UpdateLags_back_rec(pObj_00);
      }
    }
    return;
  }
  __assert_fail("!Abc_ObjIsLatch(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretMain.c"
                ,0x4f2,"void Abc_FlowRetime_UpdateLags_back_rec(Abc_Obj_t *)");
}

Assistant:

void
Abc_FlowRetime_UpdateLags_back_rec( Abc_Obj_t *pObj ) {
  Abc_Obj_t *pNext;
  int i;

  assert(!Abc_ObjIsPo(pObj));
  assert(!Abc_ObjIsLatch(pObj));

  if (Abc_ObjIsBo(pObj)) return;
  if (Abc_NodeIsTravIdCurrent(pObj)) return;

  Abc_NodeSetTravIdCurrent(pObj);

  if (Abc_ObjIsNode(pObj)) {
    Abc_FlowRetime_SetLag( pObj, 1+Abc_FlowRetime_GetLag(pObj) );
  }

  Abc_ObjForEachFanout( pObj, pNext, i ) {
    Abc_FlowRetime_UpdateLags_back_rec( pNext );
  }
}